

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

VRCORETYPE_ID __thiscall
MinVR::VRDataIndex::getType(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  VRCORETYPE_ID VVar1;
  undefined1 local_50 [48];
  
  std::__cxx11::string::string((string *)(local_50 + 0x10),(string *)nameSpace);
  _getDatum((VRDataIndex *)local_50,(string *)this,key,SUB81((string *)(local_50 + 0x10),0));
  VVar1 = *(VRCORETYPE_ID_conflict *)(local_50._0_8_ + 8);
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return VVar1;
}

Assistant:

VRCORETYPE_ID getType(const std::string &key,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    return _getDatum(key, nameSpace, inherit)->getType();
  }